

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_benchmark.c
# Opt level: O0

void run_test(uint32_t spanlen,uint32_t intvlen,double density,order_t order)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  roaring_bulk_context_t *in_stack_fffffffffffffdb8;
  roaring_bitmap_t *in_stack_fffffffffffffdc0;
  uint32_t in_stack_fffffffffffffddc;
  roaring_bitmap_t *r_00;
  long local_210;
  double *arr;
  char *in_stack_fffffffffffffe00;
  char *local_1f8;
  uint32_t *in_stack_fffffffffffffe20;
  timespec ts_11;
  int64_t i_6;
  timespec ts_10;
  roaring_bitmap_t *r_5;
  undefined1 auStack_1a8 [4];
  int p_5;
  timespec ts_9;
  long lStack_190;
  uint32_t j_3;
  int64_t i_5;
  timespec ts_8;
  roaring_bitmap_t *r_4;
  undefined1 auStack_168 [4];
  int p_4;
  timespec ts_7;
  int64_t i_4;
  timespec ts_6;
  roaring_bitmap_t *r_3;
  undefined1 auStack_130 [4];
  int p_3;
  timespec ts_5;
  long lStack_118;
  uint32_t j_2;
  int64_t i_3;
  roaring_bulk_context_t context;
  timespec ts_4;
  roaring_bitmap_t *r_2;
  undefined1 auStack_e0 [4];
  int p_2;
  timespec ts_3;
  int64_t i_2;
  timespec ts_2;
  long lStack_b0;
  uint32_t j_1;
  int64_t i_1;
  unsigned_long __vla_expr0;
  roaring_bitmap_t *r_1;
  undefined1 auStack_88 [4];
  int p_1;
  timespec ts_1;
  long lStack_70;
  uint32_t j;
  int64_t i;
  timespec ts;
  roaring_bitmap_t *r;
  int p;
  uint64_t cycles_final;
  uint64_t cycles_start;
  int num_passes;
  uint32_t count;
  uint32_t *offsets;
  order_t order_local;
  double density_local;
  uint32_t intvlen_local;
  uint32_t spanlen_local;
  
  if (order == ASC) {
    local_1f8 = "ASC";
  }
  else if (order == DESC) {
    in_stack_fffffffffffffe00 = "DESC";
    local_1f8 = in_stack_fffffffffffffe00;
  }
  else {
    in_stack_fffffffffffffe00 = "???";
    local_1f8 = in_stack_fffffffffffffe00;
    if (order == SHUFFLE) {
      in_stack_fffffffffffffe00 = "SHUFFLE";
      local_1f8 = in_stack_fffffffffffffe00;
    }
  }
  printf("intvlen=%u density=%f order=%s\n",density,(ulong)intvlen,local_1f8);
  r_00 = (roaring_bitmap_t *)0x1016a6;
  make_data(ts_10.tv_sec._4_4_,(uint32_t)ts_10.tv_sec,(double)i_6,ts_11.tv_nsec._4_4_,
            (uint32_t **)ts_11.tv_sec,in_stack_fffffffffffffe20);
  arr = (double *)&stack0xfffffffffffffdb8;
  printf("  roaring_bitmap_add():");
  for (r._4_4_ = 0; r._4_4_ < 5; r._4_4_ = r._4_4_ + 1) {
    ts.tv_nsec = (__syscall_slong_t)roaring_bitmap_create();
    clock_gettime(3,(timespec *)&i);
    lVar1 = i * 1000000000 + ts.tv_sec;
    for (lStack_70 = 0; lStack_70 < (long)(ulong)cycles_start._4_4_; lStack_70 = lStack_70 + 1) {
      for (ts_1.tv_nsec._4_4_ = 0; ts_1.tv_nsec._4_4_ < intvlen;
          ts_1.tv_nsec._4_4_ = ts_1.tv_nsec._4_4_ + 1) {
        roaring_bitmap_add((roaring_bitmap_t *)in_stack_fffffffffffffe00,
                           (uint32_t)((ulong)arr >> 0x20));
      }
    }
    clock_gettime(3,(timespec *)auStack_88);
    lVar1 = (_auStack_88 * 1000000000 + ts_1.tv_sec) - lVar1;
    auVar3._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar3._0_8_ = lVar1;
    auVar3._12_4_ = 0x45300000;
    arr[r._4_4_] = (((auVar3._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) /
                   (double)cycles_start._4_4_) / (double)intvlen;
    roaring_bitmap_free((roaring_bitmap_t *)0x1017e7);
  }
  array_min(arr,5);
  printf("          %6.1f\n");
  printf("  roaring_bitmap_add_many():");
  for (r_1._4_4_ = 0; r_1._4_4_ < 5; r_1._4_4_ = r_1._4_4_ + 1) {
    roaring_bitmap_create();
    lVar1 = -((ulong)(intvlen * cycles_start._4_4_) * 4 + 0xf & 0xfffffffffffffff0);
    local_210 = (long)&stack0xfffffffffffffdb8 + lVar1;
    for (lStack_b0 = 0; lStack_b0 < (long)(ulong)cycles_start._4_4_; lStack_b0 = lStack_b0 + 1) {
      for (ts_2.tv_nsec._4_4_ = 0; ts_2.tv_nsec._4_4_ < intvlen;
          ts_2.tv_nsec._4_4_ = ts_2.tv_nsec._4_4_ + 1) {
        *(uint *)(local_210 + (lStack_b0 * (ulong)intvlen + (ulong)ts_2.tv_nsec._4_4_) * 4) =
             *(int *)((long)_num_passes + lStack_b0 * 4) + ts_2.tv_nsec._4_4_;
      }
    }
    *(undefined8 *)(&stack0xfffffffffffffdb0 + lVar1) = 0x101919;
    clock_gettime(3,(timespec *)&i_2);
    lVar2 = i_2 * 1000000000 + ts_2.tv_sec;
    for (ts_3.tv_nsec = 0; ts_3.tv_nsec < (long)(ulong)cycles_start._4_4_;
        ts_3.tv_nsec = ts_3.tv_nsec + 1) {
      *(undefined8 *)(&stack0xfffffffffffffdb0 + lVar1) = 0x101978;
      roaring_bitmap_add_many
                (*(roaring_bitmap_t **)(&stack0xfffffffffffffe00 + lVar1),
                 *(size_t *)(&stack0xfffffffffffffdf8 + lVar1),
                 *(uint32_t **)((long)&local_210 + lVar1));
    }
    *(undefined8 *)(&stack0xfffffffffffffdb0 + lVar1) = 0x10199f;
    clock_gettime(3,(timespec *)auStack_e0);
    lVar2 = (_auStack_e0 * 1000000000 + ts_3.tv_sec) - lVar2;
    auVar4._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar4._0_8_ = lVar2;
    auVar4._12_4_ = 0x45300000;
    arr[r_1._4_4_] =
         (((auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) /
         (double)cycles_start._4_4_) / (double)intvlen;
    *(undefined8 *)(&stack0xfffffffffffffdb0 + lVar1) = 0x101a20;
    roaring_bitmap_free(*(roaring_bitmap_t **)(&stack0xfffffffffffffdb0 + lVar1));
  }
  array_min(arr,5);
  printf("     %6.1f\n");
  printf("  roaring_bitmap_add_bulk():");
  for (r_2._4_4_ = 0; r_2._4_4_ < 5; r_2._4_4_ = r_2._4_4_ + 1) {
    roaring_bitmap_create();
    clock_gettime(3,(timespec *)&context.idx);
    lVar1 = context._8_8_ * 1000000000;
    memset(&i_3,0,0x10);
    for (lStack_118 = 0; lStack_118 < (long)(ulong)cycles_start._4_4_; lStack_118 = lStack_118 + 1)
    {
      for (ts_5.tv_nsec._4_4_ = 0; ts_5.tv_nsec._4_4_ < intvlen;
          ts_5.tv_nsec._4_4_ = ts_5.tv_nsec._4_4_ + 1) {
        roaring_bitmap_add_bulk(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,0);
      }
    }
    clock_gettime(3,(timespec *)auStack_130);
    lVar1 = (_auStack_130 * 1000000000 + ts_5.tv_sec) - (lVar1 + ts_4.tv_sec);
    auVar5._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar5._0_8_ = lVar1;
    auVar5._12_4_ = 0x45300000;
    arr[r_2._4_4_] =
         (((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) /
         (double)cycles_start._4_4_) / (double)intvlen;
    roaring_bitmap_free((roaring_bitmap_t *)0x101bdb);
  }
  array_min(arr,5);
  printf("     %6.1f\n");
  printf("  roaring_bitmap_add_range():");
  for (r_3._4_4_ = 0; r_3._4_4_ < 5; r_3._4_4_ = r_3._4_4_ + 1) {
    ts_6.tv_nsec = (__syscall_slong_t)roaring_bitmap_create();
    clock_gettime(3,(timespec *)&i_4);
    lVar1 = i_4 * 1000000000 + ts_6.tv_sec;
    for (ts_7.tv_nsec = 0; ts_7.tv_nsec < (long)(ulong)cycles_start._4_4_;
        ts_7.tv_nsec = ts_7.tv_nsec + 1) {
      roaring_bitmap_add_range
                (in_stack_fffffffffffffdc0,(uint64_t)in_stack_fffffffffffffdb8,0x101cb3);
    }
    clock_gettime(3,(timespec *)auStack_168);
    lVar1 = (_auStack_168 * 1000000000 + ts_7.tv_sec) - lVar1;
    auVar6._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar6._0_8_ = lVar1;
    auVar6._12_4_ = 0x45300000;
    arr[r_3._4_4_] =
         (((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) /
         (double)cycles_start._4_4_) / (double)intvlen;
    roaring_bitmap_free((roaring_bitmap_t *)0x101d5b);
  }
  array_min(arr,5);
  printf("    %6.1f\n");
  printf("  roaring_bitmap_remove():");
  for (r_4._4_4_ = 0; r_4._4_4_ < 5; r_4._4_4_ = r_4._4_4_ + 1) {
    ts_8.tv_nsec = (__syscall_slong_t)roaring_bitmap_create();
    roaring_bitmap_add_range(in_stack_fffffffffffffdc0,(uint64_t)in_stack_fffffffffffffdb8,0x101dd4)
    ;
    clock_gettime(3,(timespec *)&i_5);
    lVar1 = i_5 * 1000000000 + ts_8.tv_sec;
    for (lStack_190 = 0; lStack_190 < (long)(ulong)cycles_start._4_4_; lStack_190 = lStack_190 + 1)
    {
      for (ts_9.tv_nsec._4_4_ = 0; ts_9.tv_nsec._4_4_ < intvlen;
          ts_9.tv_nsec._4_4_ = ts_9.tv_nsec._4_4_ + 1) {
        roaring_bitmap_remove(r_00,in_stack_fffffffffffffddc);
      }
    }
    clock_gettime(3,(timespec *)auStack_1a8);
    lVar1 = (_auStack_1a8 * 1000000000 + ts_9.tv_sec) - lVar1;
    auVar7._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar7._0_8_ = lVar1;
    auVar7._12_4_ = 0x45300000;
    arr[r_4._4_4_] =
         (((auVar7._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) /
         (double)cycles_start._4_4_) / (double)intvlen;
    roaring_bitmap_free((roaring_bitmap_t *)0x101f07);
  }
  array_min(arr,5);
  printf("       %6.1f\n");
  printf("  roaring_bitmap_remove_range():");
  for (r_5._4_4_ = 0; r_5._4_4_ < 5; r_5._4_4_ = r_5._4_4_ + 1) {
    ts_10.tv_nsec = (__syscall_slong_t)roaring_bitmap_create();
    roaring_bitmap_add_range(in_stack_fffffffffffffdc0,(uint64_t)in_stack_fffffffffffffdb8,0x101f80)
    ;
    clock_gettime(3,(timespec *)&i_6);
    lVar2 = i_6 * 1000000000;
    lVar1 = CONCAT44(ts_10.tv_sec._4_4_,(uint32_t)ts_10.tv_sec);
    for (ts_11.tv_nsec = 0; ts_11.tv_nsec < (long)(ulong)cycles_start._4_4_;
        ts_11.tv_nsec = ts_11.tv_nsec + 1) {
      roaring_bitmap_remove_range
                (in_stack_fffffffffffffdc0,(uint64_t)in_stack_fffffffffffffdb8,0x101ff4);
    }
    clock_gettime(3,(timespec *)&stack0xfffffffffffffe20);
    lVar1 = ((long)in_stack_fffffffffffffe20 * 1000000000 + ts_11.tv_sec) - (lVar2 + lVar1);
    auVar8._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar8._0_8_ = lVar1;
    auVar8._12_4_ = 0x45300000;
    arr[r_5._4_4_] =
         (((auVar8._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) /
         (double)cycles_start._4_4_) / (double)intvlen;
    roaring_bitmap_free((roaring_bitmap_t *)0x10209c);
  }
  array_min(arr,5);
  printf(" %6.1f\n");
  free(_num_passes);
  return;
}

Assistant:

void run_test(uint32_t spanlen, uint32_t intvlen, double density,
              order_t order) {
    printf("intvlen=%u density=%f order=%s\n", intvlen, density,
           (order == ASC
                ? "ASC"
                : (order == DESC ? "DESC"
                                 : (order == SHUFFLE ? "SHUFFLE" : "???"))));

    uint32_t *offsets;
    uint32_t count;
    make_data(spanlen, intvlen, density, order, &offsets, &count);
    const int num_passes = 5;
    uint64_t cycles_start, cycles_final;
    double results[num_passes];

    printf("  roaring_bitmap_add():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        RDTSC_START(cycles_start);
        for (int64_t i = 0; i < count; i++) {
            for (uint32_t j = 0; j < intvlen; j++) {
                roaring_bitmap_add(r, offsets[i] + j);
            }
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf("          %6.1f\n", array_min(results, num_passes));

    printf("  roaring_bitmap_add_many():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        uint32_t values[intvlen * count];
        for (int64_t i = 0; i < count; i++) {
            for (uint32_t j = 0; j < intvlen; j++) {
                values[i * intvlen + j] = offsets[i] + j;
            }
        }
        RDTSC_START(cycles_start);
        for (int64_t i = 0; i < count; i++) {
            roaring_bitmap_add_many(r, intvlen, values + (i * intvlen));
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf("     %6.1f\n", array_min(results, num_passes));

    printf("  roaring_bitmap_add_bulk():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        RDTSC_START(cycles_start);
        roaring_bulk_context_t context = {0, 0, 0, 0};
        for (int64_t i = 0; i < count; i++) {
            for (uint32_t j = 0; j < intvlen; j++) {
                roaring_bitmap_add_bulk(r, &context, offsets[i] + j);
            }
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf("     %6.1f\n", array_min(results, num_passes));

    printf("  roaring_bitmap_add_range():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        RDTSC_START(cycles_start);
        for (int64_t i = 0; i < count; i++) {
            roaring_bitmap_add_range(r, offsets[i], offsets[i] + intvlen);
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf("    %6.1f\n", array_min(results, num_passes));

    printf("  roaring_bitmap_remove():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        roaring_bitmap_add_range(r, 0, spanlen);
        RDTSC_START(cycles_start);
        for (int64_t i = 0; i < count; i++) {
            for (uint32_t j = 0; j < intvlen; j++) {
                roaring_bitmap_remove(r, offsets[i] + j);
            }
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf("       %6.1f\n", array_min(results, num_passes));

    printf("  roaring_bitmap_remove_range():");
    for (int p = 0; p < num_passes; p++) {
        roaring_bitmap_t *r = roaring_bitmap_create();
        roaring_bitmap_add_range(r, 0, spanlen);
        RDTSC_START(cycles_start);
        for (int64_t i = 0; i < count; i++) {
            roaring_bitmap_remove_range(r, offsets[i], offsets[i] + intvlen);
        }
        RDTSC_FINAL(cycles_final);
        results[p] = (cycles_final - cycles_start) * 1.0 / count / intvlen;
        roaring_bitmap_free(r);
    }
    printf(" %6.1f\n", array_min(results, num_passes));

    free(offsets);
}